

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O0

void plutovg_path_traverse_dashed
               (plutovg_path_t *path,float offset,float *dashes,int ndashes,
               plutovg_path_traverse_func_t traverse_func,void *closure)

{
  bool bVar1;
  float *local_78;
  dasher_t dasher;
  int i;
  float dash_sum;
  void *closure_local;
  plutovg_path_traverse_func_t traverse_func_local;
  int ndashes_local;
  float *dashes_local;
  float offset_local;
  plutovg_path_t *path_local;
  
  dasher.closure._4_4_ = 0.0;
  for (dasher.closure._0_4_ = 0; (int)dasher.closure < ndashes;
      dasher.closure._0_4_ = (int)dasher.closure + 1) {
    dasher.closure._4_4_ = dashes[(int)dasher.closure] + dasher.closure._4_4_;
  }
  if (ndashes % 2 == 1) {
    dasher.closure._4_4_ = dasher.closure._4_4_ * 2.0;
  }
  if (0.0 < dasher.closure._4_4_) {
    local_78 = dashes;
    dasher.dashes._0_4_ = ndashes;
    dasher.dashes._4_4_ = fmodf(offset,dasher.closure._4_4_);
    if (dasher.dashes._4_4_ < 0.0) {
      dasher.dashes._4_4_ = dasher.closure._4_4_ + dasher.dashes._4_4_;
    }
    dasher.start_phase = 0.0;
    dasher.start_index._0_1_ = 1;
    while( true ) {
      bVar1 = false;
      if (0.0 < dasher.dashes._4_4_) {
        bVar1 = local_78[(int)dasher.start_phase % (int)dasher.dashes] <= dasher.dashes._4_4_;
      }
      if (!bVar1) break;
      dasher.dashes._4_4_ =
           dasher.dashes._4_4_ - dashes[(int)dasher.start_phase % (int)dasher.dashes];
      dasher.start_index._0_1_ = ((byte)dasher.start_index ^ 0xff) & 1;
      dasher.start_phase = (float)((int)dasher.start_phase + 1);
    }
    dasher.ndashes = (int)dasher.dashes._4_4_;
    dasher.phase = dasher.start_phase;
    dasher.start_index._1_1_ = (byte)dasher.start_index;
    dasher.index = 0;
    dasher.start_toggle = false;
    dasher.toggle = false;
    dasher._30_2_ = 0;
    dasher.current_point = (plutovg_point_t)traverse_func;
    dasher.traverse_func = (plutovg_path_traverse_func_t)closure;
    plutovg_path_traverse_flatten(path,dash_traverse_func,&local_78);
  }
  else {
    plutovg_path_traverse(path,traverse_func,closure);
  }
  return;
}

Assistant:

void plutovg_path_traverse_dashed(const plutovg_path_t* path, float offset, const float* dashes, int ndashes, plutovg_path_traverse_func_t traverse_func, void* closure)
{
    float dash_sum = 0.f;
    for(int i = 0; i < ndashes; ++i)
        dash_sum += dashes[i];
    if(ndashes % 2 == 1)
        dash_sum *= 2.f;
    if(dash_sum <= 0.f) {
        plutovg_path_traverse(path, traverse_func, closure);
        return;
    }

    dasher_t dasher;
    dasher.dashes = dashes;
    dasher.ndashes = ndashes;
    dasher.start_phase = fmodf(offset, dash_sum);
    if(dasher.start_phase < 0.f)
        dasher.start_phase += dash_sum;
    dasher.start_index = 0;
    dasher.start_toggle = true;
    while(dasher.start_phase > 0.f && dasher.start_phase >= dasher.dashes[dasher.start_index % dasher.ndashes]) {
        dasher.start_phase -= dashes[dasher.start_index % dasher.ndashes];
        dasher.start_toggle = !dasher.start_toggle;
        dasher.start_index++;
    }

    dasher.phase = dasher.start_phase;
    dasher.index = dasher.start_index;
    dasher.toggle = dasher.start_toggle;
    dasher.current_point = PLUTOVG_EMPTY_POINT;
    dasher.traverse_func = traverse_func;
    dasher.closure = closure;
    plutovg_path_traverse_flatten(path, dash_traverse_func, &dasher);
}